

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  seqDef **ppsVar1;
  long *plVar2;
  ulong *iEnd;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  ulong *mEnd;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  long lVar11;
  seqDef *psVar12;
  ulong uVar13;
  bool bVar14;
  BYTE *op_1;
  size_t sVar15;
  BYTE *pBVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  uint uVar21;
  uint uVar22;
  long *plVar23;
  uint uVar24;
  ulong uVar26;
  BYTE *ip;
  BYTE *iStart;
  ulong *puVar27;
  int *piVar28;
  ulong uVar29;
  ulong *puVar30;
  long *plVar31;
  ulong uVar32;
  ulong uVar33;
  U32 UVar34;
  BYTE *pBVar35;
  BYTE *unaff_R13;
  U32 UVar36;
  U32 UVar37;
  long *plVar38;
  long *plVar39;
  int iVar40;
  BYTE *base;
  U32 prefixStartIndex;
  BYTE *iend;
  BYTE *ilimit;
  BYTE *prefixStart;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  U32 dictStartIndex;
  BYTE *dictStart;
  U32 *dictHashTable;
  U32 local_104;
  ulong uVar25;
  
  pBVar6 = (ms->window).base;
  uVar3 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar3;
  pZVar7 = ms->dictMatchState;
  uVar4 = (pZVar7->window).dictLimit;
  mEnd = (ulong *)(pZVar7->window).nextSrc;
  pBVar8 = (pZVar7->window).base;
  pBVar35 = pBVar8 + uVar4;
  uVar24 = ((int)pBVar8 - (int)mEnd) + uVar3;
  uVar25 = (ulong)uVar24;
  iEnd = (ulong *)((long)src + srcSize);
  plVar2 = (long *)((long)src + (srcSize - 8));
  plVar38 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar35) + (long)src);
  uVar5 = (ms->cParams).minMatch;
  pUVar9 = ms->hashTable;
  local_104 = *rep;
  UVar34 = rep[1];
  pUVar10 = pZVar7->hashTable;
  iVar40 = (int)pBVar6;
  if (uVar5 == 5) {
    if (plVar38 < plVar2) {
      uVar5 = (ms->cParams).targetLength;
      uVar19 = (ulong)(uVar5 + (uVar5 == 0));
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      ppsVar1 = &seqStore->sequences;
      do {
        lVar11 = *plVar38;
        uVar29 = (ulong)(lVar11 * -0x30e4432345000000) >> (bVar17 & 0x3f);
        uVar26 = (long)plVar38 - (long)pBVar6;
        UVar37 = (U32)uVar26;
        uVar21 = (UVar37 - local_104) + 1;
        piVar28 = (int *)(pBVar6 + uVar21);
        if (uVar21 < uVar3) {
          piVar28 = (int *)(pBVar8 + (uVar21 - uVar24));
        }
        uVar18 = pUVar9[uVar29];
        pUVar9[uVar29] = UVar37;
        if (((uVar3 - 1) - uVar21 < 3) || (*piVar28 != *(int *)((long)plVar38 + 1))) {
          plVar39 = plVar38;
          if (uVar3 < uVar18) {
            piVar28 = (int *)(pBVar6 + uVar18);
            if (*piVar28 == (int)*plVar38) {
              puVar20 = (ulong *)((long)plVar38 + 4);
              puVar30 = (ulong *)(piVar28 + 1);
              puVar27 = puVar20;
              if (puVar20 < (ulong *)((long)iEnd - 7U)) {
                uVar32 = *puVar20 ^ *puVar30;
                uVar29 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
                if (*puVar30 == *puVar20) {
                  puVar27 = (ulong *)((long)plVar38 + 0xc);
                  puVar30 = (ulong *)(piVar28 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_00112949;
                    uVar29 = *puVar30;
                    uVar32 = *puVar27;
                    uVar33 = uVar32 ^ uVar29;
                    uVar13 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar20))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar30 = puVar30 + 1;
                  } while (uVar29 == uVar32);
                }
              }
              else {
LAB_00112949:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar30 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar30 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
                }
                pBVar16 = (BYTE *)((long)puVar27 - (long)puVar20);
              }
              unaff_R13 = pBVar16 + 4;
              if ((uVar3 < uVar18) && (src < plVar38)) {
                pBVar16 = pBVar6 + ((ulong)uVar18 - 1);
                do {
                  plVar23 = (long *)((long)plVar39 + -1);
                  if ((*(BYTE *)plVar23 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= iStart)) break;
                  pBVar16 = pBVar16 + -1;
                } while (src < plVar23);
              }
              UVar36 = (int)plVar38 - (int)piVar28;
              uVar29 = (long)plVar39 - (long)src;
              plVar23 = (long *)seqStore->lit;
              plVar38 = (long *)((long)plVar23 + uVar29);
              do {
                *plVar23 = *src;
                plVar23 = plVar23 + 1;
                src = (void *)((long)src + 8);
              } while (plVar23 < plVar38);
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar16 = unaff_R13 + -3;
              psVar12 = *ppsVar1;
              psVar12->litLength = (U16)uVar29;
              psVar12->offset = UVar36 + 3;
              UVar34 = local_104;
              goto joined_r0x00112a65;
            }
            plVar38 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
          }
          else {
            uVar21 = pUVar10[(ulong)(lVar11 * -0x30e4432345000000) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar4 < uVar21) && (*(int *)(pBVar8 + uVar21) == (int)*plVar38)) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar38 + 4),(BYTE *)((long)(pBVar8 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar15 + 4);
              if ((uVar4 < uVar21) && (src < plVar38)) {
                pBVar16 = pBVar8 + ((ulong)uVar21 - 1);
                do {
                  plVar23 = (long *)((long)plVar38 + -1);
                  plVar39 = plVar38;
                  if ((*(BYTE *)plVar23 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= pBVar35)) break;
                  pBVar16 = pBVar16 + -1;
                  plVar38 = plVar23;
                } while (src < plVar23);
              }
              UVar36 = UVar37 - (uVar24 + uVar21);
              uVar29 = (long)plVar39 - (long)src;
              plVar23 = (long *)seqStore->lit;
              plVar38 = (long *)((long)plVar23 + uVar29);
              plVar31 = (long *)src;
              do {
                *plVar23 = *plVar31;
                plVar23 = plVar23 + 1;
                plVar31 = plVar31 + 1;
              } while (plVar23 < plVar38);
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar29;
              psVar12->offset = UVar36 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar12 + 1;
              bVar14 = true;
              UVar34 = local_104;
              local_104 = UVar36;
            }
            else {
              plVar39 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
              bVar14 = false;
            }
            plVar38 = plVar39;
            if (bVar14) goto LAB_00112b2d;
          }
        }
        else {
          plVar39 = (long *)((long)plVar38 + 1);
          puVar20 = iEnd;
          if (uVar21 < uVar3) {
            puVar20 = mEnd;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar38 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar20,iStart);
          uVar29 = (long)plVar39 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar38 = (long *)((long)plVar23 + uVar29);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar38);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar15 + 4);
          pBVar16 = (BYTE *)(sVar15 + 1);
          psVar12 = *ppsVar1;
          psVar12->litLength = (U16)uVar29;
          psVar12->offset = 1;
          UVar36 = local_104;
joined_r0x00112a65:
          local_104 = UVar36;
          if ((BYTE *)0xffff < pBVar16) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)pBVar16;
          *ppsVar1 = psVar12 + 1;
LAB_00112b2d:
          src = (void *)((long)plVar39 + (long)unaff_R13);
          plVar38 = (long *)src;
          if (src <= plVar2) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar17 & 0x3f)] = UVar37 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
                 ((int)src + -2) - iVar40;
            do {
              plVar38 = (long *)src;
              if (plVar2 < src) break;
              UVar37 = (int)src - iVar40;
              uVar21 = UVar37 - UVar34;
              pBVar16 = pBVar6;
              if (uVar21 < uVar3) {
                pBVar16 = pBVar8 + -uVar25;
              }
              if (((uVar3 - 1) - uVar21 < 3) || (*(int *)(pBVar16 + uVar21) != (int)*src)) {
                bVar14 = false;
                UVar37 = UVar34;
              }
              else {
                puVar20 = iEnd;
                if (uVar21 < uVar3) {
                  puVar20 = mEnd;
                }
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar21) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar20,iStart);
                *(long *)seqStore->lit = *src;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < sVar15 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(sVar15 + 1);
                seqStore->sequences = psVar12 + 1;
                pUVar9[(ulong)(*src * -0x30e4432345000000) >> (bVar17 & 0x3f)] = UVar37;
                src = (void *)((long)src + sVar15 + 4);
                bVar14 = true;
                UVar37 = local_104;
                local_104 = UVar34;
              }
              UVar34 = UVar37;
              plVar38 = (long *)src;
            } while (bVar14);
          }
        }
      } while (plVar38 < plVar2);
    }
  }
  else if (uVar5 == 6) {
    if (plVar38 < plVar2) {
      uVar5 = (ms->cParams).targetLength;
      uVar19 = (ulong)(uVar5 + (uVar5 == 0));
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      ppsVar1 = &seqStore->sequences;
      do {
        lVar11 = *plVar38;
        uVar29 = (ulong)(lVar11 * -0x30e4432340650000) >> (bVar17 & 0x3f);
        uVar26 = (long)plVar38 - (long)pBVar6;
        UVar37 = (U32)uVar26;
        uVar21 = (UVar37 - local_104) + 1;
        piVar28 = (int *)(pBVar6 + uVar21);
        if (uVar21 < uVar3) {
          piVar28 = (int *)(pBVar8 + (uVar21 - uVar24));
        }
        uVar18 = pUVar9[uVar29];
        pUVar9[uVar29] = UVar37;
        if (((uVar3 - 1) - uVar21 < 3) || (*piVar28 != *(int *)((long)plVar38 + 1))) {
          plVar39 = plVar38;
          if (uVar3 < uVar18) {
            piVar28 = (int *)(pBVar6 + uVar18);
            if (*piVar28 == (int)*plVar38) {
              puVar20 = (ulong *)((long)plVar38 + 4);
              puVar30 = (ulong *)(piVar28 + 1);
              puVar27 = puVar20;
              if (puVar20 < (ulong *)((long)iEnd - 7U)) {
                uVar32 = *puVar20 ^ *puVar30;
                uVar29 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
                if (*puVar30 == *puVar20) {
                  puVar27 = (ulong *)((long)plVar38 + 0xc);
                  puVar30 = (ulong *)(piVar28 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_0011228a;
                    uVar29 = *puVar30;
                    uVar32 = *puVar27;
                    uVar33 = uVar32 ^ uVar29;
                    uVar13 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar20))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar30 = puVar30 + 1;
                  } while (uVar29 == uVar32);
                }
              }
              else {
LAB_0011228a:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar30 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar30 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
                }
                pBVar16 = (BYTE *)((long)puVar27 - (long)puVar20);
              }
              unaff_R13 = pBVar16 + 4;
              if ((uVar3 < uVar18) && (src < plVar38)) {
                pBVar16 = pBVar6 + ((ulong)uVar18 - 1);
                do {
                  plVar23 = (long *)((long)plVar39 + -1);
                  if ((*(BYTE *)plVar23 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= iStart)) break;
                  pBVar16 = pBVar16 + -1;
                } while (src < plVar23);
              }
              UVar36 = (int)plVar38 - (int)piVar28;
              uVar29 = (long)plVar39 - (long)src;
              plVar23 = (long *)seqStore->lit;
              plVar38 = (long *)((long)plVar23 + uVar29);
              do {
                *plVar23 = *src;
                plVar23 = plVar23 + 1;
                src = (void *)((long)src + 8);
              } while (plVar23 < plVar38);
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar16 = unaff_R13 + -3;
              psVar12 = *ppsVar1;
              psVar12->litLength = (U16)uVar29;
              psVar12->offset = UVar36 + 3;
              UVar34 = local_104;
              goto joined_r0x001123a6;
            }
            plVar38 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
          }
          else {
            uVar21 = pUVar10[(ulong)(lVar11 * -0x30e4432340650000) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar4 < uVar21) && (*(int *)(pBVar8 + uVar21) == (int)*plVar38)) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar38 + 4),(BYTE *)((long)(pBVar8 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar15 + 4);
              if ((uVar4 < uVar21) && (src < plVar38)) {
                pBVar16 = pBVar8 + ((ulong)uVar21 - 1);
                do {
                  plVar23 = (long *)((long)plVar38 + -1);
                  plVar39 = plVar38;
                  if ((*(BYTE *)plVar23 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= pBVar35)) break;
                  pBVar16 = pBVar16 + -1;
                  plVar38 = plVar23;
                } while (src < plVar23);
              }
              UVar36 = UVar37 - (uVar24 + uVar21);
              uVar29 = (long)plVar39 - (long)src;
              plVar23 = (long *)seqStore->lit;
              plVar38 = (long *)((long)plVar23 + uVar29);
              plVar31 = (long *)src;
              do {
                *plVar23 = *plVar31;
                plVar23 = plVar23 + 1;
                plVar31 = plVar31 + 1;
              } while (plVar23 < plVar38);
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar29;
              psVar12->offset = UVar36 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar12 + 1;
              bVar14 = true;
              UVar34 = local_104;
              local_104 = UVar36;
            }
            else {
              plVar39 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
              bVar14 = false;
            }
            plVar38 = plVar39;
            if (bVar14) goto LAB_0011246e;
          }
        }
        else {
          plVar39 = (long *)((long)plVar38 + 1);
          puVar20 = iEnd;
          if (uVar21 < uVar3) {
            puVar20 = mEnd;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar38 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar20,iStart);
          uVar29 = (long)plVar39 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar38 = (long *)((long)plVar23 + uVar29);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar38);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar15 + 4);
          pBVar16 = (BYTE *)(sVar15 + 1);
          psVar12 = *ppsVar1;
          psVar12->litLength = (U16)uVar29;
          psVar12->offset = 1;
          UVar36 = local_104;
joined_r0x001123a6:
          local_104 = UVar36;
          if ((BYTE *)0xffff < pBVar16) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)pBVar16;
          *ppsVar1 = psVar12 + 1;
LAB_0011246e:
          src = (void *)((long)plVar39 + (long)unaff_R13);
          plVar38 = (long *)src;
          if (src <= plVar2) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar17 & 0x3f)] = UVar37 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
                 ((int)src + -2) - iVar40;
            do {
              plVar38 = (long *)src;
              if (plVar2 < src) break;
              UVar37 = (int)src - iVar40;
              uVar21 = UVar37 - UVar34;
              pBVar16 = pBVar6;
              if (uVar21 < uVar3) {
                pBVar16 = pBVar8 + -uVar25;
              }
              if (((uVar3 - 1) - uVar21 < 3) || (*(int *)(pBVar16 + uVar21) != (int)*src)) {
                bVar14 = false;
                UVar37 = UVar34;
              }
              else {
                puVar20 = iEnd;
                if (uVar21 < uVar3) {
                  puVar20 = mEnd;
                }
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar21) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar20,iStart);
                *(long *)seqStore->lit = *src;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < sVar15 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(sVar15 + 1);
                seqStore->sequences = psVar12 + 1;
                pUVar9[(ulong)(*src * -0x30e4432340650000) >> (bVar17 & 0x3f)] = UVar37;
                src = (void *)((long)src + sVar15 + 4);
                bVar14 = true;
                UVar37 = local_104;
                local_104 = UVar34;
              }
              UVar34 = UVar37;
              plVar38 = (long *)src;
            } while (bVar14);
          }
        }
      } while (plVar38 < plVar2);
    }
  }
  else if (uVar5 == 7) {
    if (plVar38 < plVar2) {
      uVar5 = (ms->cParams).targetLength;
      uVar19 = (ulong)(uVar5 + (uVar5 == 0));
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      ppsVar1 = &seqStore->sequences;
      do {
        lVar11 = *plVar38;
        uVar29 = (ulong)(lVar11 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        uVar26 = (long)plVar38 - (long)pBVar6;
        UVar37 = (U32)uVar26;
        uVar21 = (UVar37 - local_104) + 1;
        piVar28 = (int *)(pBVar6 + uVar21);
        if (uVar21 < uVar3) {
          piVar28 = (int *)(pBVar8 + (uVar21 - uVar24));
        }
        uVar18 = pUVar9[uVar29];
        pUVar9[uVar29] = UVar37;
        if (((uVar3 - 1) - uVar21 < 3) || (*piVar28 != *(int *)((long)plVar38 + 1))) {
          plVar39 = plVar38;
          if (uVar3 < uVar18) {
            piVar28 = (int *)(pBVar6 + uVar18);
            if (*piVar28 == (int)*plVar38) {
              puVar20 = (ulong *)((long)plVar38 + 4);
              puVar30 = (ulong *)(piVar28 + 1);
              puVar27 = puVar20;
              if (puVar20 < (ulong *)((long)iEnd - 7U)) {
                uVar32 = *puVar20 ^ *puVar30;
                uVar29 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
                if (*puVar30 == *puVar20) {
                  puVar27 = (ulong *)((long)plVar38 + 0xc);
                  puVar30 = (ulong *)(piVar28 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_00111bba;
                    uVar29 = *puVar30;
                    uVar32 = *puVar27;
                    uVar33 = uVar32 ^ uVar29;
                    uVar13 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar20))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar30 = puVar30 + 1;
                  } while (uVar29 == uVar32);
                }
              }
              else {
LAB_00111bba:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar30 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar30 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
                }
                pBVar16 = (BYTE *)((long)puVar27 - (long)puVar20);
              }
              unaff_R13 = pBVar16 + 4;
              if ((uVar3 < uVar18) && (src < plVar38)) {
                pBVar16 = pBVar6 + ((ulong)uVar18 - 1);
                do {
                  plVar23 = (long *)((long)plVar39 + -1);
                  if ((*(BYTE *)plVar23 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= iStart)) break;
                  pBVar16 = pBVar16 + -1;
                } while (src < plVar23);
              }
              UVar36 = (int)plVar38 - (int)piVar28;
              uVar29 = (long)plVar39 - (long)src;
              plVar23 = (long *)seqStore->lit;
              plVar38 = (long *)((long)plVar23 + uVar29);
              do {
                *plVar23 = *src;
                plVar23 = plVar23 + 1;
                src = (void *)((long)src + 8);
              } while (plVar23 < plVar38);
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar16 = unaff_R13 + -3;
              psVar12 = *ppsVar1;
              psVar12->litLength = (U16)uVar29;
              psVar12->offset = UVar36 + 3;
              UVar34 = local_104;
              goto joined_r0x00111cd6;
            }
            plVar38 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
          }
          else {
            uVar21 = pUVar10[(ulong)(lVar11 * -0x30e44323405a9d00) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar4 < uVar21) && (*(int *)(pBVar8 + uVar21) == (int)*plVar38)) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar38 + 4),(BYTE *)((long)(pBVar8 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar15 + 4);
              if ((uVar4 < uVar21) && (src < plVar38)) {
                pBVar16 = pBVar8 + ((ulong)uVar21 - 1);
                do {
                  plVar23 = (long *)((long)plVar38 + -1);
                  plVar39 = plVar38;
                  if ((*(BYTE *)plVar23 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= pBVar35)) break;
                  pBVar16 = pBVar16 + -1;
                  plVar38 = plVar23;
                } while (src < plVar23);
              }
              UVar36 = UVar37 - (uVar24 + uVar21);
              uVar29 = (long)plVar39 - (long)src;
              plVar23 = (long *)seqStore->lit;
              plVar38 = (long *)((long)plVar23 + uVar29);
              plVar31 = (long *)src;
              do {
                *plVar23 = *plVar31;
                plVar23 = plVar23 + 1;
                plVar31 = plVar31 + 1;
              } while (plVar23 < plVar38);
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar29;
              psVar12->offset = UVar36 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar12 + 1;
              bVar14 = true;
              UVar34 = local_104;
              local_104 = UVar36;
            }
            else {
              plVar39 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
              bVar14 = false;
            }
            plVar38 = plVar39;
            if (bVar14) goto LAB_00111d9e;
          }
        }
        else {
          plVar39 = (long *)((long)plVar38 + 1);
          puVar20 = iEnd;
          if (uVar21 < uVar3) {
            puVar20 = mEnd;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar38 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar20,iStart);
          uVar29 = (long)plVar39 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar38 = (long *)((long)plVar23 + uVar29);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar38);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar15 + 4);
          pBVar16 = (BYTE *)(sVar15 + 1);
          psVar12 = *ppsVar1;
          psVar12->litLength = (U16)uVar29;
          psVar12->offset = 1;
          UVar36 = local_104;
joined_r0x00111cd6:
          local_104 = UVar36;
          if ((BYTE *)0xffff < pBVar16) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)pBVar16;
          *ppsVar1 = psVar12 + 1;
LAB_00111d9e:
          src = (void *)((long)plVar39 + (long)unaff_R13);
          plVar38 = (long *)src;
          if (src <= plVar2) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar17 & 0x3f)] = UVar37 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
                 ((int)src + -2) - iVar40;
            do {
              plVar38 = (long *)src;
              if (plVar2 < src) break;
              UVar37 = (int)src - iVar40;
              uVar21 = UVar37 - UVar34;
              pBVar16 = pBVar6;
              if (uVar21 < uVar3) {
                pBVar16 = pBVar8 + -uVar25;
              }
              if (((uVar3 - 1) - uVar21 < 3) || (*(int *)(pBVar16 + uVar21) != (int)*src)) {
                bVar14 = false;
                UVar37 = UVar34;
              }
              else {
                puVar20 = iEnd;
                if (uVar21 < uVar3) {
                  puVar20 = mEnd;
                }
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar21) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar20,iStart);
                *(long *)seqStore->lit = *src;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < sVar15 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(sVar15 + 1);
                seqStore->sequences = psVar12 + 1;
                pUVar9[(ulong)(*src * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] = UVar37;
                src = (void *)((long)src + sVar15 + 4);
                bVar14 = true;
                UVar37 = local_104;
                local_104 = UVar34;
              }
              UVar34 = UVar37;
              plVar38 = (long *)src;
            } while (bVar14);
          }
        }
      } while (plVar38 < plVar2);
    }
  }
  else if (plVar38 < plVar2) {
    uVar5 = (ms->cParams).targetLength;
    uVar19 = (ulong)(uVar5 + (uVar5 == 0));
    bVar17 = 0x20 - (char)(ms->cParams).hashLog;
    uVar5 = (pZVar7->cParams).hashLog;
    ppsVar1 = &seqStore->sequences;
    do {
      uVar22 = (uint)((int)*plVar38 * -0x61c8864f) >> (bVar17 & 0x1f);
      uVar26 = (long)plVar38 - (long)pBVar6;
      uVar21 = pUVar9[uVar22];
      UVar37 = (U32)uVar26;
      uVar18 = (UVar37 - local_104) + 1;
      piVar28 = (int *)(pBVar6 + uVar18);
      if (uVar18 < uVar3) {
        piVar28 = (int *)(pBVar8 + (uVar18 - uVar24));
      }
      pUVar9[uVar22] = UVar37;
      if (((uVar3 - 1) - uVar18 < 3) || (*piVar28 != *(int *)((long)plVar38 + 1))) {
        plVar39 = plVar38;
        if (uVar3 < uVar21) {
          piVar28 = (int *)(pBVar6 + uVar21);
          if (*piVar28 == (int)*plVar38) {
            puVar20 = (ulong *)((long)plVar38 + 4);
            puVar30 = (ulong *)(piVar28 + 1);
            puVar27 = puVar20;
            if (puVar20 < (ulong *)((long)iEnd - 7U)) {
              uVar32 = *puVar20 ^ *puVar30;
              uVar29 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              pBVar16 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar30 == *puVar20) {
                puVar27 = (ulong *)((long)plVar38 + 0xc);
                puVar30 = (ulong *)(piVar28 + 3);
                do {
                  if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_00113005;
                  uVar29 = *puVar30;
                  uVar32 = *puVar27;
                  uVar33 = uVar32 ^ uVar29;
                  uVar13 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar20));
                  puVar27 = puVar27 + 1;
                  puVar30 = puVar30 + 1;
                } while (uVar29 == uVar32);
              }
            }
            else {
LAB_00113005:
              if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar30 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar30 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar27 < iEnd) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar27));
              }
              pBVar16 = (BYTE *)((long)puVar27 - (long)puVar20);
            }
            unaff_R13 = pBVar16 + 4;
            if ((uVar3 < uVar21) && (src < plVar38)) {
              pBVar16 = pBVar6 + ((ulong)uVar21 - 1);
              do {
                plVar23 = (long *)((long)plVar39 + -1);
                if ((*(BYTE *)plVar23 != *pBVar16) ||
                   (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= iStart)) break;
                pBVar16 = pBVar16 + -1;
              } while (src < plVar23);
            }
            UVar36 = (int)plVar38 - (int)piVar28;
            uVar29 = (long)plVar39 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar38 = (long *)((long)plVar23 + uVar29);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar38);
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar16 = unaff_R13 + -3;
            psVar12 = *ppsVar1;
            psVar12->litLength = (U16)uVar29;
            psVar12->offset = UVar36 + 3;
            UVar34 = local_104;
            goto joined_r0x00113129;
          }
          plVar38 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
        }
        else {
          uVar21 = pUVar10[(uint)((int)*plVar38 * -0x61c8864f) >> (0x20U - (char)uVar5 & 0x1f)];
          if ((uVar4 < uVar21) && (*(int *)(pBVar8 + uVar21) == (int)*plVar38)) {
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar38 + 4),(BYTE *)((long)(pBVar8 + uVar21) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            unaff_R13 = (BYTE *)(sVar15 + 4);
            if ((uVar4 < uVar21) && (src < plVar38)) {
              pBVar16 = pBVar8 + ((ulong)uVar21 - 1);
              do {
                plVar23 = (long *)((long)plVar38 + -1);
                plVar39 = plVar38;
                if ((*(BYTE *)plVar23 != *pBVar16) ||
                   (unaff_R13 = unaff_R13 + 1, plVar39 = plVar23, pBVar16 <= pBVar35)) break;
                pBVar16 = pBVar16 + -1;
                plVar38 = plVar23;
              } while (src < plVar23);
            }
            UVar36 = UVar37 - (uVar24 + uVar21);
            uVar29 = (long)plVar39 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar38 = (long *)((long)plVar23 + uVar29);
            plVar31 = (long *)src;
            do {
              *plVar23 = *plVar31;
              plVar23 = plVar23 + 1;
              plVar31 = plVar31 + 1;
            } while (plVar23 < plVar38);
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12 = seqStore->sequences;
            psVar12->litLength = (U16)uVar29;
            psVar12->offset = UVar36 + 3;
            if ((BYTE *)0xffff < unaff_R13 + -3) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(unaff_R13 + -3);
            seqStore->sequences = psVar12 + 1;
            bVar14 = true;
            UVar34 = local_104;
            local_104 = UVar36;
          }
          else {
            plVar39 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + uVar19);
            bVar14 = false;
          }
          plVar38 = plVar39;
          if (bVar14) goto LAB_001131f5;
        }
      }
      else {
        plVar39 = (long *)((long)plVar38 + 1);
        puVar20 = iEnd;
        if (uVar18 < uVar3) {
          puVar20 = mEnd;
        }
        sVar15 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar38 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar20,iStart);
        uVar29 = (long)plVar39 - (long)src;
        plVar23 = (long *)seqStore->lit;
        plVar38 = (long *)((long)plVar23 + uVar29);
        do {
          *plVar23 = *src;
          plVar23 = plVar23 + 1;
          src = (void *)((long)src + 8);
        } while (plVar23 < plVar38);
        seqStore->lit = seqStore->lit + uVar29;
        if (0xffff < uVar29) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        unaff_R13 = (BYTE *)(sVar15 + 4);
        pBVar16 = (BYTE *)(sVar15 + 1);
        psVar12 = *ppsVar1;
        psVar12->litLength = (U16)uVar29;
        psVar12->offset = 1;
        UVar36 = local_104;
joined_r0x00113129:
        local_104 = UVar36;
        if ((BYTE *)0xffff < pBVar16) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)pBVar16;
        *ppsVar1 = psVar12 + 1;
LAB_001131f5:
        src = (void *)((long)plVar39 + (long)unaff_R13);
        plVar38 = (long *)src;
        if (src <= plVar2) {
          pUVar9[(uint)(*(int *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar17 & 0x1f)] = UVar37 + 2;
          pUVar9[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               ((int)src + -2) - iVar40;
          do {
            plVar38 = (long *)src;
            if (plVar2 < src) break;
            UVar37 = (int)src - iVar40;
            uVar21 = UVar37 - UVar34;
            pBVar16 = pBVar6;
            if (uVar21 < uVar3) {
              pBVar16 = pBVar8 + -uVar25;
            }
            if (((uVar3 - 1) - uVar21 < 3) || (*(int *)(pBVar16 + uVar21) != (int)*src)) {
              bVar14 = false;
              UVar37 = UVar34;
            }
            else {
              puVar20 = iEnd;
              if (uVar21 < uVar3) {
                puVar20 = mEnd;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar20,iStart);
              *(long *)seqStore->lit = *src;
              psVar12 = seqStore->sequences;
              psVar12->litLength = 0;
              psVar12->offset = 1;
              if (0xffff < sVar15 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(sVar15 + 1);
              seqStore->sequences = psVar12 + 1;
              pUVar9[(uint)((int)*src * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar37;
              src = (void *)((long)src + sVar15 + 4);
              bVar14 = true;
              UVar37 = local_104;
              local_104 = UVar34;
            }
            UVar34 = UVar37;
            plVar38 = (long *)src;
          } while (bVar14);
        }
      }
    } while (plVar38 < plVar2);
  }
  *rep = local_104;
  rep[1] = UVar34;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}